

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SentencePiece.cc
# Opt level: O2

void __thiscall
onmt::SentencePiece::set_vocabulary
          (SentencePiece *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vocabulary,Options *options)

{
  pointer pbVar1;
  SentencePieceProcessor *pSVar2;
  invalid_argument *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  pointer __args;
  Status status;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  vocabulary_views;
  string local_48;
  
  if ((options != (Options *)0x0) &&
     ((options->joiner_annotate != false || (options->spacer_new == true)))) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar3,
               "SentencePiece vocabulary restriction requires the tokenization to use \"spacer_annotate\" (same as spm_encode)"
              );
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  vocabulary_views.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vocabulary_views.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vocabulary_views.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::reserve(&vocabulary_views,
            (long)(vocabulary->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(vocabulary->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5);
  pbVar1 = (vocabulary->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__args = (vocabulary->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; __args != pbVar1; __args = __args + 1) {
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::emplace_back<std::__cxx11::string_const&>
              ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)&vocabulary_views,__args);
  }
  pSVar2 = (this->_processor)._M_t.
           super___uniq_ptr_impl<sentencepiece::SentencePieceProcessor,_std::default_delete<sentencepiece::SentencePieceProcessor>_>
           ._M_t.
           super__Tuple_impl<0UL,_sentencepiece::SentencePieceProcessor_*,_std::default_delete<sentencepiece::SentencePieceProcessor>_>
           .super__Head_base<0UL,_sentencepiece::SentencePieceProcessor_*,_false>._M_head_impl;
  (*pSVar2->_vptr_SentencePieceProcessor[10])(&status,pSVar2,&vocabulary_views);
  if (status.rep_._M_t.
      super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
      ._M_t.
      super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
      .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl ==
      (__uniq_ptr_data<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>,_true,_true>
       )0x0) {
    sentencepiece::util::Status::~Status(&status);
    std::
    _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~_Vector_base(&vocabulary_views.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   );
    return;
  }
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  sentencepiece::util::Status::ToString_abi_cxx11_(&local_48,&status);
  std::invalid_argument::invalid_argument(piVar3,(string *)&local_48);
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void SentencePiece::set_vocabulary(const std::vector<std::string>& vocabulary,
                                     const Tokenizer::Options* options)
  {
    if (options && (options->joiner_annotate || options->spacer_new))
      throw std::invalid_argument("SentencePiece vocabulary restriction requires the tokenization "
                                  "to use \"spacer_annotate\" (same as spm_encode)");
    std::vector<std::string_view> vocabulary_views;
    vocabulary_views.reserve(vocabulary.size());
    for (const auto& s : vocabulary) {
        vocabulary_views.emplace_back(s);
    }
    auto status = _processor->SetVocabulary(vocabulary_views);
    if (!status.ok())
      throw std::invalid_argument(status.ToString());
  }